

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

void __thiscall
QAbstractScrollAreaPrivate::replaceScrollBar
          (QAbstractScrollAreaPrivate *this,QScrollBar *scrollBar,Orientation orientation)

{
  char *pcVar1;
  QAbstractScrollAreaScrollBarContainer *parent;
  QWidget *widget;
  int iVar2;
  int max;
  Orientation orientation_00;
  ConnectionType CVar3;
  long in_FS_OFFSET;
  bool bVar4;
  Connection CStack_48;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  parent = (this->scrollBarContainers).m_data[(long)(int)orientation + -1];
  bVar4 = orientation != Horizontal;
  CVar3 = 0x5f7747;
  if (!bVar4) {
    CVar3 = 0x5f7737;
  }
  widget = *(QWidget **)((long)(&this->scrollBarContainers + 1) + (ulong)bVar4 * 8);
  *(QScrollBar **)((long)(&this->scrollBarContainers + 1) + (ulong)bVar4 * 8) = scrollBar;
  QWidget::setParent((QWidget *)scrollBar,&parent->super_QWidget);
  parent->scrollBar = scrollBar;
  QLayout::removeWidget(&parent->layout->super_QLayout,widget);
  QBoxLayout::insertWidget(parent->layout,0,(QWidget *)scrollBar,0,(Alignment)0x0);
  bVar4 = QWidget::isVisibleTo(widget,&parent->super_QWidget);
  (**(code **)(*(long *)&(scrollBar->super_QAbstractSlider).super_QWidget + 0x68))(scrollBar,bVar4);
  bVar4 = QAbstractSlider::invertedAppearance((QAbstractSlider *)widget);
  QAbstractSlider::setInvertedAppearance(&scrollBar->super_QAbstractSlider,bVar4);
  bVar4 = QAbstractSlider::invertedControls((QAbstractSlider *)widget);
  QAbstractSlider::setInvertedControls(&scrollBar->super_QAbstractSlider,bVar4);
  iVar2 = QAbstractSlider::minimum((QAbstractSlider *)widget);
  max = QAbstractSlider::maximum((QAbstractSlider *)widget);
  QAbstractSlider::setRange(&scrollBar->super_QAbstractSlider,iVar2,max);
  orientation_00 = QAbstractSlider::orientation((QAbstractSlider *)widget);
  QAbstractSlider::setOrientation(&scrollBar->super_QAbstractSlider,orientation_00);
  iVar2 = QAbstractSlider::pageStep((QAbstractSlider *)widget);
  QAbstractSlider::setPageStep(&scrollBar->super_QAbstractSlider,iVar2);
  iVar2 = QAbstractSlider::singleStep((QAbstractSlider *)widget);
  QAbstractSlider::setSingleStep(&scrollBar->super_QAbstractSlider,iVar2);
  *(undefined1 *)(*(long *)&(scrollBar->super_QAbstractSlider).super_QWidget.field_0x8 + 0x274) =
       *(undefined1 *)(*(long *)&widget->field_0x8 + 0x274);
  bVar4 = QAbstractSlider::isSliderDown((QAbstractSlider *)widget);
  QAbstractSlider::setSliderDown(&scrollBar->super_QAbstractSlider,bVar4);
  iVar2 = QAbstractSlider::sliderPosition((QAbstractSlider *)widget);
  QAbstractSlider::setSliderPosition(&scrollBar->super_QAbstractSlider,iVar2);
  bVar4 = QAbstractSlider::hasTracking((QAbstractSlider *)widget);
  QAbstractSlider::setTracking(&scrollBar->super_QAbstractSlider,bVar4);
  iVar2 = QAbstractSlider::value((QAbstractSlider *)widget);
  QAbstractSlider::setValue(&scrollBar->super_QAbstractSlider,iVar2);
  QObject::installEventFilter((QObject *)scrollBar);
  QObject::removeEventFilter(&widget->super_QObject);
  (**(code **)(*(long *)widget + 0x20))(widget);
  QObject::connect(local_40,(char *)scrollBar,(QObject *)"2valueChanged(int)",pcVar1,CVar3);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect((QObject *)&CStack_48,(char *)scrollBar,(QObject *)"2rangeChanged(int,int)",
                   pcVar1,0x5f776e);
  QMetaObject::Connection::~Connection(&CStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::replaceScrollBar(QScrollBar *scrollBar,
                                                  Qt::Orientation orientation)
{
    Q_Q(QAbstractScrollArea);

    QAbstractScrollAreaScrollBarContainer *container = scrollBarContainers[orientation];
    bool horizontal = (orientation == Qt::Horizontal);
    QScrollBar *oldBar = horizontal ? hbar : vbar;
    if (horizontal)
        hbar = scrollBar;
    else
        vbar = scrollBar;
    scrollBar->setParent(container);
    container->scrollBar = scrollBar;
    container->layout->removeWidget(oldBar);
    container->layout->insertWidget(0, scrollBar);
    scrollBar->setVisible(oldBar->isVisibleTo(container));
    scrollBar->setInvertedAppearance(oldBar->invertedAppearance());
    scrollBar->setInvertedControls(oldBar->invertedControls());
    scrollBar->setRange(oldBar->minimum(), oldBar->maximum());
    scrollBar->setOrientation(oldBar->orientation());
    scrollBar->setPageStep(oldBar->pageStep());
    scrollBar->setSingleStep(oldBar->singleStep());
    scrollBar->d_func()->viewMayChangeSingleStep = oldBar->d_func()->viewMayChangeSingleStep;
    scrollBar->setSliderDown(oldBar->isSliderDown());
    scrollBar->setSliderPosition(oldBar->sliderPosition());
    scrollBar->setTracking(oldBar->hasTracking());
    scrollBar->setValue(oldBar->value());
    scrollBar->installEventFilter(q);
    oldBar->removeEventFilter(q);
    delete oldBar;

    QObject::connect(scrollBar, SIGNAL(valueChanged(int)),
                     q, horizontal ? SLOT(_q_hslide(int)) : SLOT(_q_vslide(int)));
    QObject::connect(scrollBar, SIGNAL(rangeChanged(int,int)),
                     q, SLOT(_q_showOrHideScrollBars()), Qt::QueuedConnection);
}